

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe50At6(uint8_t *buf)

{
  uint64_t res;
  uint8_t *buf_local;
  
  return (long)((int)(uint)*buf >> 6) | (ulong)*(uint6 *)(buf + 1) << 2;
}

Assistant:

std::uint64_t readFlUIntLe50At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 2;
    res |= (buf[0] >> 6);
    res &= UINT64_C(0x3ffffffffffff);
    return res;
}